

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 9918.cpp
# Opt level: O3

ssize_t __thiscall
TI::TMS::TMS9918<(TI::TMS::Personality)0>::write
          (TMS9918<(TI::TMS::Personality)0> *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  ssize_t extraout_RAX;
  
  if ((__fd & 1U) == 0) {
    (this->super_Base<(TI::TMS::Personality)0>).write_phase_ = false;
    (this->super_Base<(TI::TMS::Personality)0>).read_ahead_buffer_ = (uint8_t)__buf;
    (this->super_Base<(TI::TMS::Personality)0>).queued_access_ = Write;
    uVar1 = (this->super_Base<(TI::TMS::Personality)0>).fetch_pointer_.column + 6;
    (this->super_Base<(TI::TMS::Personality)0>).minimum_access_column_ = uVar1;
    return (ulong)uVar1;
  }
  Base<(TI::TMS::Personality)0>::write_register
            (&this->super_Base<(TI::TMS::Personality)0>,(uint8_t)__buf);
  return extraout_RAX;
}

Assistant:

void TMS9918<personality>::write(int address, uint8_t value) {
	switch(this->masked_address(address)) {
		default: break;
		case 0:	this->write_vram(value);				break;
		case 1:	this->write_register(value);			break;
		case 2:	this->write_palette(value);				break;
		case 3: this->write_register_indirect(value);	break;
	}
}